

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O3

int str_num_base(char **linep,curl_off_t *nump,curl_off_t max,int base)

{
  char cVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  
  iVar3 = 0x37;
  if (base == 0x10) {
    iVar3 = 0x66;
  }
  iVar6 = 0x39;
  if (base != 10) {
    iVar6 = iVar3;
  }
  *nump = 0;
  cVar1 = **linep;
  uVar4 = (uint)cVar1;
  iVar3 = 8;
  if (((int)uVar4 <= iVar6 && 0x2f < (int)uVar4) &&
     ((0x1ffffff81fc00U >> ((ulong)(byte)(cVar1 - 0x30) & 0x3f) & 1) == 0)) {
    uVar7 = (ulong)(uint)base;
    pcVar8 = *linep + 1;
    lVar2 = 0;
    if (max < (long)uVar7) {
      do {
        pcVar5 = pcVar8;
        lVar2 = lVar2 * uVar7 +
                (ulong)((byte)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                              [(ulong)(uVar4 & 0xff) + 0x20] & 0xf);
        if (max < lVar2) {
          return 7;
        }
        uVar4 = (uint)*pcVar5;
      } while (((0x2f < (int)uVar4) && ((int)uVar4 <= iVar6)) &&
              (pcVar8 = pcVar5 + 1,
              (0x1ffffff81fc00U >> ((ulong)(byte)(*pcVar5 - 0x30) & 0x3f) & 1) == 0));
    }
    else {
      do {
        pcVar5 = pcVar8;
        if ((long)(max - (ulong)((byte)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                                       [(ulong)(uVar4 & 0xff) + 0x20] & 0xf)) / (long)uVar7 < lVar2)
        {
          return 7;
        }
        lVar2 = lVar2 * uVar7 +
                (ulong)((byte)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                              [(ulong)(uVar4 & 0xff) + 0x20] & 0xf);
        uVar4 = (uint)*pcVar5;
      } while (((0x2f < (int)uVar4) && ((int)uVar4 <= iVar6)) &&
              (pcVar8 = pcVar5 + 1,
              (0x1ffffff81fc00U >> ((ulong)(byte)(*pcVar5 - 0x30) & 0x3f) & 1) == 0));
    }
    *nump = lVar2;
    *linep = pcVar5;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int str_num_base(const char **linep, curl_off_t *nump, curl_off_t max,
                        int base) /* 8, 10 or 16, nothing else */
{
  curl_off_t num = 0;
  const char *p;
  int m = (base == 10) ? '9' :   /* the largest digit possible */
    (base == 16) ? 'f' : '7';
  DEBUGASSERT(linep && *linep && nump);
  DEBUGASSERT((base == 8) || (base == 10) || (base == 16));
  DEBUGASSERT(max >= 0); /* mostly to catch SIZE_T_MAX, which is too large */
  *nump = 0;
  p = *linep;
  if(!valid_digit(*p, m))
    return STRE_NO_NUM;
  if(max < base) {
    /* special-case low max scenario because check needs to be different */
    do {
      int n = Curl_hexval(*p++);
      num = num * base + n;
      if(num > max)
        return STRE_OVERFLOW;
    } while(valid_digit(*p, m));
  }
  else {
    do {
      int n = Curl_hexval(*p++);
      if(num > ((max - n) / base))
        return STRE_OVERFLOW;
      num = num * base + n;
    } while(valid_digit(*p, m));
  }
  *nump = num;
  *linep = p;
  return STRE_OK;
}